

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_SetSlope(secplane_t *plane,bool setCeil,int xyangi,int zangi,DVector3 *pos)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  DVector3 norm;
  TVector3<double> local_38;
  
  bVar1 = (byte)ib_compatflags;
  if (zangi < 0xb4) {
    if (zangi < 1) {
      dVar2 = 1.0;
    }
    else {
      dVar2 = (double)zangi;
    }
  }
  else {
    dVar2 = 179.0;
  }
  if (setCeil) {
    dVar2 = dVar2 + 180.0;
  }
  dVar3 = fastcosdeg(dVar2);
  dVar4 = (double)xyangi;
  if ((bVar1 & 1) == 0) {
    local_38.X = fastcosdeg(dVar4);
    local_38.X = dVar3 * local_38.X;
    dVar3 = fastcosdeg(dVar2);
    local_38.Y = fastsindeg(dVar4);
    local_38.Y = local_38.Y * dVar3;
  }
  else {
    dVar5 = fastcosdeg(dVar4);
    local_38.X = (double)(SUB84(dVar5 + 103079215104.0,0) * SUB84(dVar3 + 103079215104.0,0)) *
                 1.52587890625e-05 * 1.52587890625e-05;
    dVar3 = fastcosdeg(dVar2);
    dVar4 = fastsindeg(dVar4);
    local_38.Y = (double)(SUB84(dVar4 + 103079215104.0,0) * SUB84(dVar3 + 103079215104.0,0)) *
                 1.52587890625e-05 * 1.52587890625e-05;
  }
  local_38.Z = fastsindeg(dVar2);
  TVector3<double>::MakeUnit(&local_38);
  dVar2 = pos->Z;
  dVar3 = pos->X;
  dVar4 = pos->Y;
  (plane->normal).X = local_38.X;
  (plane->normal).Y = local_38.Y;
  (plane->normal).Z = local_38.Z;
  plane->D = (-local_38.X * dVar3 - local_38.Y * dVar4) - dVar2 * local_38.Z;
  plane->negiC = -1.0 / local_38.Z;
  return;
}

Assistant:

void P_SetSlope (secplane_t *plane, bool setCeil, int xyangi, int zangi, const DVector3 &pos)
{
	DAngle xyang;
	DAngle zang;

	if (zangi >= 180)
	{
		zang = 179.;
	}
	else if (zangi <= 0)
	{
		zang = 1.;
	}
	else
	{
		zang = (double)zangi;
	}
	if (setCeil)
	{
		zang += 180.;
	}

	xyang = (double)xyangi;

	DVector3 norm;

	if (ib_compatflags & BCOMPATF_SETSLOPEOVERFLOW)
	{
		// We have to consider an integer multiplication overflow here.
		norm[0] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Cos())) / 65536.;
		norm[1] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Sin())) / 65536.;
	}
	else
	{
		norm[0] = zang.Cos() * xyang.Cos();
		norm[1] = zang.Cos() * xyang.Sin();
	}
	norm[2] = zang.Sin();
	norm.MakeUnit();
	double dist = -norm[0] * pos.X - norm[1] * pos.Y - norm[2] * pos.Z;
	plane->set(norm[0], norm[1], norm[2], dist);
}